

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,TableIndexField *table_i_field,void *data)

{
  pointer pSVar1;
  undefined8 in_RDI;
  ExpVarData exp_var_data;
  ExpVarData local_24 [3];
  
  ExpVarData::ExpVarData(local_24,SemanticOp_Read);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e5caa);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,local_24);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e5ccb);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,local_24);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(TableIndexField *table_i_field, void *data)
    {
        // Table index_ and value_ expressions are read semantic
        ExpVarData exp_var_data{ SemanticOp_Read };
        table_i_field->index_->Accept(this, &exp_var_data);
        table_i_field->value_->Accept(this, &exp_var_data);
    }